

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

size_t __thiscall
CVmObjDate::format_date
          (CVmObjDate *this,char *buf,size_t buflen,char *fmt,size_t fmtlen,CVmDateLocale *lc,
          multicaldate_t *date,int32_t dayno,int32_t daytime,char *tzabbr,int32_t tzofs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  size_t __n;
  char *fmt_00;
  size_t sVar5;
  long lVar6;
  int iVar7;
  byte leadsp;
  long val;
  int iVar8;
  byte *pbVar9;
  int *piVar10;
  byte bVar11;
  int iVar12;
  size_t sVar13;
  ulong uVar14;
  bool bVar15;
  ldiv_t lVar16;
  byte *local_150;
  size_t local_148;
  size_t local_140;
  CVmDateLocale *local_138;
  size_t subfmtl;
  uint local_128;
  int local_124;
  int hh;
  uint local_11c;
  uint local_118;
  int local_114;
  ulong local_110;
  CVmObjDate *local_108;
  byte *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  double local_e0;
  int iy;
  ulong local_d4;
  bignum_t<32> bdn;
  undefined8 local_78 [3];
  bignum_t<32> result;
  bignum_t<32> bdt;
  
  local_140 = 0;
  local_150 = (byte *)buf;
  local_148 = buflen;
  if (fmtlen != 0) {
    iVar8 = daytime >> 0x1f;
    local_e0 = ((double)(dayno + -0xafa6c) * 24.0 * 60.0 * 60.0 + (double)(daytime / 1000)) -
               (double)(tzofs / 1000);
    local_110 = (ulong)(uint)-tzofs;
    local_114 = daytime % 1000;
    local_e8 = (ulong)(uint)((daytime / 1000) % 0x3c);
    local_f0 = (ulong)(uint)(43199999 < daytime);
    local_118 = (43199999 < daytime) + 2;
    local_f8 = (ulong)(uint)((daytime / 60000) % 0x3c);
    iVar7 = daytime / 3600000 + iVar8;
    local_11c = iVar7 - iVar8;
    uVar3 = (iVar7 + -0xc) - iVar8;
    if (daytime < 46800000) {
      uVar3 = local_11c;
    }
    hh = 0xc;
    if (0x6ddcfe < daytime + 3599999U) {
      hh = uVar3;
    }
    local_124 = dayno + 1;
    local_100 = (byte *)(tzabbr + 1);
    local_138 = lc;
    local_108 = this;
    do {
      if ((fmtlen == 1) || (*fmt != 0x25)) {
        local_140 = local_140 + 1;
LAB_0028e9c3:
        if (local_148 != 0) {
          *local_150 = *fmt;
LAB_0028e9e4:
          local_150 = local_150 + 1;
          local_148 = local_148 - 1;
        }
        goto LAB_0028f2e1;
      }
      fmt = (char *)((byte *)fmt + 1);
      fmtlen = fmtlen - 1;
      iVar7 = 0;
      if (fmtlen < 2) {
        leadsp = 0;
        bVar11 = 0;
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        bVar11 = 0;
        leadsp = 0;
        iVar7 = 0;
        do {
          bVar15 = *fmt == 0x23;
          if (bVar15) {
            fmt = (char *)((byte *)fmt + 1);
            fmtlen = fmtlen - 1;
            iVar8 = 1;
          }
          if (fmtlen < 2) {
            fmtlen = 1;
          }
          else {
            bVar1 = *fmt;
            if ((bVar1 == 0x20) || (bVar1 == 0x15)) {
              fmt = (char *)((byte *)fmt + 1);
              fmtlen = fmtlen - 1;
              bVar15 = true;
              leadsp = bVar1;
            }
          }
          uVar14 = 1;
          if ((1 < fmtlen) && (uVar14 = fmtlen, *fmt == 0x2d)) {
            fmt = (char *)((byte *)fmt + 1);
            uVar14 = fmtlen - 1;
            bVar15 = true;
            bVar11 = 1;
          }
          fmtlen = 1;
          if ((1 < uVar14) && (fmtlen = uVar14, *fmt == 0x26)) {
            fmt = (char *)((byte *)fmt + 1);
            fmtlen = uVar14 - 1;
            iVar7 = 1;
            bVar15 = true;
          }
        } while ((bVar15) && (1 < fmtlen));
      }
      bVar1 = *fmt;
      switch(bVar1) {
      case 0x25:
        local_140 = local_140 + 1;
        if (local_148 == 0) goto LAB_0028f2e1;
        *local_150 = 0x25;
        goto LAB_0028e9e4;
      default:
        if (local_148 != 0) {
          *local_150 = 0x25;
          local_148 = local_148 - 1;
          local_150 = local_150 + 1;
        }
        local_140 = local_140 + 2;
        goto LAB_0028e9c3;
      case 0x41:
        uVar3 = (*date->_vptr_multicaldate_t[4])();
        iVar7 = 2;
        goto LAB_0028edc8;
      case 0x42:
        uVar14 = (ulong)(date->m_ - 1);
        iVar7 = 0;
        goto LAB_0028f27a;
      case 0x43:
        uVar14 = (ulong)(uint)(date->y_ / 100);
        break;
      case 0x44:
        iVar7 = 0xb;
        goto LAB_0028eee7;
      case 0x45:
      case 0x65:
        iVar12 = date->y_;
        iVar2 = 1 - iVar12;
        if (0 < iVar12) {
          iVar2 = iVar12;
        }
        if ((((bool)(bVar1 == 0x65 & bVar11)) || ((bool)(bVar1 == 0x45 & ~bVar11 & 0 < iVar12))) ||
           (((byte)~bVar11 == 0 && iVar12 < 1) && bVar1 == 0x45)) {
          _wrtlistitem((char **)&local_150,&local_148,&local_140,local_138,5,(uint)(iVar12 < 1),0);
          local_140 = local_140 + 1;
          if (local_148 != 0) {
            *local_150 = 0x20;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
          iVar12 = 1;
          goto LAB_0028f41c;
        }
        local_128 = (uint)(iVar12 < 1);
        _wrtnum((char **)&local_150,&local_148,&local_140,iVar2,1,iVar8,leadsp,iVar7);
        local_140 = local_140 + 1;
        if (local_148 != 0) {
          *local_150 = 0x20;
          local_148 = local_148 - 1;
          local_150 = local_150 + 1;
        }
        iVar7 = 5;
        uVar14 = (ulong)local_128;
        lc = local_138;
        goto LAB_0028f27a;
      case 0x46:
        subfmtl = 8;
        fmt_00 = "%Y-%m-%d";
        goto LAB_0028eeef;
      case 0x47:
      case 0x67:
        (*date->_vptr_multicaldate_t[6])(date,&iy);
        iVar12 = (uint)(*fmt != 0x67) * 2 + 2;
        lc = local_138;
        iVar2 = iy;
        goto LAB_0028f2d8;
      case 0x48:
        uVar14 = (ulong)local_11c;
        break;
      case 0x49:
        uVar14 = (ulong)(uint)hh;
        break;
      case 0x4a:
        piVar10 = (int *)(local_108->super_CVmObject).ext_;
        lVar6 = (long)piVar10[1];
        val = lVar6 + -43200000;
        if (lVar6 < 0x2932e01) {
          val = lVar6;
        }
        bdn.ext[0] = ' ';
        bdn.ext[1] = '\0';
        bdn.ext[4] = '\0';
        CVmObjBigNum::set_int_val(bdn.ext,(ulong)(43200000 < lVar6) + (long)*piVar10);
        bdt.ext[0] = ' ';
        bdt.ext[1] = '\0';
        bdt.ext[4] = '\0';
        CVmObjBigNum::set_int_val(bdt.ext,val);
        bignum_t<32>::operator+=(&bdn,0x1a431f);
        iy = CONCAT22(iy._2_2_,0x20);
        local_d4 = local_d4 & 0xffffffffffffff00;
        CVmObjBigNum::set_int_val((char *)&iy,86400000);
        result.ext[0] = ' ';
        result.ext[1] = '\0';
        result.ext._4_4_ = result.ext._4_4_ & 0xffffff00;
        CVmObjBigNum::compute_quotient_into(result.ext,(char *)0x0,bdt.ext,(char *)&iy);
        local_78[0] = CONCAT44(result.ext._4_4_,CONCAT22(result.ext._2_2_,result.ext._0_2_));
        iy = CONCAT22(iy._2_2_,0x20);
        local_d4 = local_d4 & 0xffffffffffffff00;
        CVmObjBigNum::compute_sum_into((char *)&iy,bdn.ext,(char *)local_78);
        CVmObjBigNum::copy_val(bdn.ext,(char *)&iy,1);
        CVmObjBigNum::cvt_to_string_buf((char *)&iy,0x40,bdn.ext,-1,-1,10,-1,0x10,(char *)0x0,0);
        pbVar9 = local_150;
        __n = (size_t)(ushort)iy;
        sVar13 = local_148 - __n;
        if (local_148 < __n) {
          if (local_148 != 0) {
            piVar10 = (int *)((long)&iy + 2);
LAB_0028f0f6:
            sVar13 = local_148;
            pbVar9 = local_150;
            memcpy(local_150,piVar10,local_148);
            local_150 = pbVar9 + sVar13;
            local_148 = 0;
          }
        }
        else {
          memcpy(local_150,(void *)((long)&iy + 2),__n);
          local_150 = pbVar9 + __n;
          local_148 = sVar13;
        }
        goto LAB_0028f37b;
      case 0x4d:
        uVar14 = local_f8;
        break;
      case 0x4e:
        iVar2 = local_114;
        goto LAB_0028f251;
      case 0x50:
        iVar7 = 4;
        uVar14 = local_f0;
        goto LAB_0028f27a;
      case 0x52:
        iVar7 = 0xd;
        goto LAB_0028eee7;
      case 0x53:
        uVar14 = local_e8;
        break;
      case 0x54:
        iVar7 = 0xe;
        goto LAB_0028eee7;
      case 0x55:
        iVar2 = 0;
        goto LAB_0028eeb5;
      case 0x56:
        iVar2 = (*date->_vptr_multicaldate_t[6])(date,0);
        goto LAB_0028eeba;
      case 0x57:
        iVar2 = 1;
LAB_0028eeb5:
        iVar2 = multicaldate_t::weekno(date,iVar2);
LAB_0028eeba:
        iVar12 = 2;
        goto LAB_0028f2d8;
      case 0x58:
        iVar7 = 9;
        goto LAB_0028eee7;
      case 0x59:
        iVar2 = date->y_;
        iVar12 = 4;
        goto LAB_0028f2d8;
      case 0x5a:
        local_140 = local_140 + 1;
        if (tzofs < 0) {
          uVar3 = (uint)local_110;
          if (local_148 != 0) {
            *local_150 = 0x2d;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
        }
        else {
          uVar3 = tzofs;
          if (local_148 != 0) {
            *local_150 = 0x2b;
            local_148 = local_148 - 1;
            local_150 = local_150 + 1;
          }
        }
        _wrtnum((char **)&local_150,&local_148,&local_140,uVar3 / 3600000,2,iVar8,leadsp,iVar7);
        iVar2 = uVar3 / 60000 + (uVar3 / 3600000) * -0x3c;
        iVar12 = 2;
        iVar8 = 0;
LAB_0028f41c:
        _wrtnum((char **)&local_150,&local_148,&local_140,iVar2,iVar12,iVar8,leadsp,iVar7);
        lc = local_138;
        goto LAB_0028f2e1;
      case 0x61:
        uVar3 = (*date->_vptr_multicaldate_t[4])();
        iVar7 = 3;
LAB_0028edc8:
        uVar14 = (ulong)uVar3;
        goto LAB_0028f27a;
      case 0x62:
        iVar7 = 1;
        uVar14 = (ulong)(date->m_ - 1);
        goto LAB_0028f27a;
      case 99:
        iVar7 = 8;
        goto LAB_0028eee7;
      case 100:
        uVar3 = date->d_;
        goto LAB_0028f163;
      case 0x6a:
        iy = date->y_;
        local_d4 = 0x100000001;
        iVar4 = caldate_t::dayno((caldate_t *)&iy);
        iVar2 = local_124 - iVar4;
LAB_0028f251:
        iVar12 = 3;
        goto LAB_0028f2d8;
      case 0x6d:
        uVar3 = date->m_;
LAB_0028f163:
        uVar14 = (ulong)uVar3;
        break;
      case 0x70:
        iVar7 = 4;
        uVar14 = (ulong)local_118;
LAB_0028f27a:
        iVar8 = (int)uVar14;
        iVar2 = 0;
LAB_0028f27c:
        _wrtlistitem((char **)&local_150,&local_148,&local_140,lc,iVar7,iVar8,iVar2);
        goto LAB_0028f2e1;
      case 0x72:
        iVar7 = 0xc;
        goto LAB_0028eee7;
      case 0x73:
        sprintf((char *)&iy,"%.0lf",SUB84(local_e0,0));
        __n = strlen((char *)&iy);
        pbVar9 = local_150;
        sVar13 = local_148 - __n;
        if (local_148 < __n) {
          if (local_148 != 0) {
            piVar10 = &iy;
            goto LAB_0028f0f6;
          }
        }
        else {
          memcpy(local_150,&iy,__n);
          local_150 = pbVar9 + __n;
          local_148 = sVar13;
        }
LAB_0028f37b:
        local_140 = local_140 + __n;
        lc = local_138;
        goto LAB_0028f2e1;
      case 0x74:
        _wrtnum((char **)&local_150,&local_148,&local_140,date->d_,1,iVar8,leadsp,iVar7);
        iVar7 = date->d_;
        iVar2 = iVar7 % 10;
        iVar8 = iVar2 + -1 + (uint)(9 < iVar7) * 4;
        if (3 < iVar2) {
          iVar8 = 3;
        }
        if (iVar2 == 0) {
          iVar8 = 3;
        }
        if (iVar7 - 0xbU < 9) {
          iVar8 = 3;
        }
        iVar7 = 7;
        iVar2 = 1;
        lc = local_138;
        goto LAB_0028f27c;
      case 0x75:
        iVar2 = (*date->_vptr_multicaldate_t[5])();
        goto LAB_0028f2b6;
      case 0x77:
        iVar2 = (*date->_vptr_multicaldate_t[4])();
LAB_0028f2b6:
        iVar12 = 1;
        goto LAB_0028f2d8;
      case 0x78:
        iVar7 = 10;
LAB_0028eee7:
        fmt_00 = CVmDateLocale::get(lc,&subfmtl,iVar7);
LAB_0028eeef:
        sVar13 = local_148;
        pbVar9 = local_150;
        sVar5 = format_date(local_108,(char *)local_150,local_148,fmt_00,subfmtl,lc,date,dayno,
                            daytime,tzabbr,tzofs);
        local_140 = local_140 + sVar5;
        local_148 = sVar13 - sVar5;
        if (sVar13 < sVar5) {
          local_150 = pbVar9 + sVar13;
          local_148 = 0;
        }
        else {
          local_150 = pbVar9 + sVar5;
        }
        goto LAB_0028f2e1;
      case 0x79:
        lVar16 = ldiv((long)date->y_,100);
        uVar14 = lVar16.rem;
        break;
      case 0x7a:
        bVar11 = *tzabbr;
        pbVar9 = local_100;
        while (bVar11 != 0) {
          if (local_148 != 0) {
            *local_150 = bVar11;
            local_150 = local_150 + 1;
            local_148 = local_148 - 1;
          }
          local_140 = local_140 + 1;
          bVar11 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        }
        goto LAB_0028f2e1;
      }
      iVar12 = 2;
      iVar2 = (int)uVar14;
LAB_0028f2d8:
      _wrtnum((char **)&local_150,&local_148,&local_140,iVar2,iVar12,iVar8,leadsp,iVar7);
LAB_0028f2e1:
      fmt = (char *)((byte *)fmt + 1);
      fmtlen = fmtlen - 1;
    } while (fmtlen != 0);
  }
  if (local_148 != 0) {
    *local_150 = 0;
  }
  return local_140;
}

Assistant:

size_t CVmObjDate::format_date(VMG_ char *buf, size_t buflen,
                               const char *fmt, size_t fmtlen,
                               CVmDateLocale *lc,
                               const multicaldate_t *date,
                               int32_t dayno, int32_t daytime,
                               const char *tzabbr, int32_t tzofs) const
{
    const char *subfmt;
    size_t subfmtl;
    
    /* we haven't written anything to the buffer yet */
    size_t outlen = 0;

    /* scan the format string */
    for ( ; fmtlen != 0 ; ++fmt, --fmtlen)
    {
        if (*fmt == '%' && fmtlen >= 2)
        {
            /* skip the '%' */
            ++fmt, --fmtlen;

            /* parse flags */
            int pound = FALSE;
            int minus = FALSE;
            int roman = FALSE;
            char leadsp = 0;
            for (int found_flag = TRUE ; found_flag && fmtlen >= 2 ; )
            {
                /* assume we won't find another flag on this pass */
                found_flag = FALSE;
                
                /* check for the '#' flag (meaning varies by format code) */
                if (fmtlen >= 2 && *fmt == '#')
                {
                    pound = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
                
                /* ' ' and '\ ' (replace leading zeros with spaces) */
                if (fmtlen >= 2 && (*fmt == ' ' || *fmt == 0x15))
                {
                    leadsp = *fmt;
                    found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '-' flag */
                if (fmtlen >= 2 && *fmt == '-')
                {
                    minus = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '&' flag */
                if (fmtlen >= 2 && *fmt == '&')
                {
                    roman = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
            }

            /* get the format code */
            switch (*fmt)
            {
            case 'a':
                /* abbreviated day name */
                wrtlistitem(LC_WKDY, date->weekday(), FALSE);
                break;

            case 'A':
                /* full day name */
                wrtlistitem(LC_WEEKDAY, date->weekday(), FALSE);
                break;

            case 'd':
                /* two-digit day of month (or one digit with '#') */
                wrtnum(date->d(), 2);
                break;

            case 'j':
                /* day of year 001-366, three digits with leading zeros */
                {
                    /* 
                     *   we can calculate the day of the year by subtracting
                     *   the day number of Jan 1 from the given date (and
                     *   adding 1 to get into range 1-366) 
                     */
                    caldate_t jan1(date->y(), 1, 1);
                    int j = dayno - jan1.dayno() + 1;
                    wrtnum(j, 3);
                }
                break;

            case 'J':
                /* 
                 *   Julian day number (the 4713 BC kind); '#' suppresses the
                 *   fractional part 
                 */
                {
                    /* get the day and time */
                    long dn = get_dayno(), dt = get_daytime();

                    /* if the time is past noon, it's on the next day */
                    if (dt > 12*60*60*1000)
                        dn += 1, dt -= 12*60*60*1000;

                    /* 
                     *   figure the combined date/time value, adjusting the
                     *   day number to the Julian day Epoch 
                     */
                    bignum_t<32> bdn(dn), bdt(dt);
                    bdn += 1721119L;
                    bdn += (bdt / (long)(24*60*60*1000));

                    /* format it and write it */
                    char jbuf[64];
                    bdn.format(jbuf, sizeof(jbuf), -1, 10);
                    wrttstr(jbuf);
                }
                break;

            case 'u':
                /* day of week 1-7 Monday-Sunday (ISO weekday) */
                wrtnum(date->iso_weekday(), 1);
                break;

            case 'w':
                /* day of week 0-6 Sunday-Saturday */
                wrtnum(date->weekday(), 1);
                break;

            case 't':
                /* day of month with ordinal suffix (non-strftime) */
                wrtnum(date->d(), 1);
                wrtlistitem(LC_ORDSUF, ordinal_index(date->d()), TRUE);
                break;

            case 'U':
                /* week number, 00-53, week 1 starting with first Sunday */
                wrtnum(date->weekno(0), 2);
                break;

            case 'W':
                /* week number, 00-53, week 1 starting with first Monday */
                wrtnum(date->weekno(1), 2);
                break;

            case 'V':
                /* ISO-8601:1988 week number of the year */
                wrtnum(date->iso_weekno(0), 2);
                break;

            case 'b':
                /* abbreviated month name */
                wrtlistitem(LC_MON, date->m() - 1, FALSE);
                break;

            case 'B':
                /* full month name */
                wrtlistitem(LC_MONTH, date->m() - 1, FALSE);
                break;

            case 'm':
                /* two-digit month 01-12 (one digit with #) */
                wrtnum(date->m(), 2);
                break;

            case 'C':
                /* two-digit century (e.g., 19 for 1900-1999) */
                wrtnum(date->y() / 100, 2);
                break;

            case 'g':
            case 'G':
                /* ISO-8601:1988 year ('g'=2 digits, 'G'=4 digits) */
                {
                    /* ISO-8601:1988 week number of the year */
                    int iy;
                    date->iso_weekno(&iy);
                    wrtnum(iy, *fmt == 'g' ? 2 : 4);
                }
                break;

            case 'y':
                /* two-digit year */
                wrtnum(ldiv(date->y(), 100).rem, 2);
                break;

            case 'Y':
                /* four-digit year */
                wrtnum(date->y(), 4);
                break;

            case 'e':
            case 'E':
                /* 
                 *   Year with AD/BC era before/after the year number.  For
                 *   'e', the era is always after, or always before on '-'.
                 *   For 'E', the era is AD before/BC after, or reversed on
                 *   '-'. 
                 */
                {
                    /* figure the era: positive years are AD, <=0 are BC */
                    int idx = 0; // assume AD
                    int yy = date->y();
                    if (yy <= 0)
                    {
                        idx = 1; // BC
                        yy = -yy + 1;
                    }

                    /* 
                     *   Figure the display order: "%-e" puts the era first
                     *   in all case; "%E" puts AD first; "%-E" puts BC first
                     */
                    if ((*fmt == 'e' && minus)
                        || (*fmt == 'E' && !minus && idx == 0)
                        || (*fmt == 'E' && minus && idx == 1))
                    {
                        /* era first */
                        wrtlistitem(LC_ERA, idx, FALSE);
                        wrtch(' ');
                        wrtnum(yy, 1);
                    }
                    else
                    {
                        /* year first */
                        wrtnum(yy, 1);
                        wrtch(' ');
                        wrtlistitem(LC_ERA, idx, FALSE);
                    }
                }
                break;

            case 'H':
                /* two-digit hour, 24-hour clock */
                wrtnum(daytime/(60*60*1000), 2);
                break;

            case 'I':
                /* two-digit hour, 12-hour clock */
                {
                    int hh = daytime/(60*60*1000);
                    if (hh == 0)
                        hh = 12;
                    else if (hh >= 13)
                        hh -= 12;

                    wrtnum(hh, 2);
                }
                break;

            case 'M':
                /* two-digit minute */
                wrtnum(daytime/(60*1000) % 60, 2);
                break;

            case 'P':
                /* upper-case AM or PM */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 1 : 0, FALSE);
                break;

            case 'p':
                /* lower-case am or pm */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 3 : 2, FALSE);
                break;

            case 'r':
                /* full 12-hour clock time: %I:%M:%S %P */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_12HOUR);
                goto do_subfmt;

            do_subfmt:
                {
                    /* recursively format the new format string */
                    size_t l = format_date(
                        vmg_ buf, buflen, subfmt, subfmtl, lc,
                        date, dayno, daytime, tzabbr, tzofs);

                    /* count it in our output length */
                    outlen += l;

                    /* advance our buffer pointer past the copied text */
                    if (buflen >= l)
                        buflen -= l, buf += l;
                    else
                        buf += buflen, buflen = 0;
                }
                break;

            case 'R':
                /* 24-hour clock time w/minutes: %H:%M */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOUR);
                goto do_subfmt;

            case 'S':
                /* two-digit seconds */
                wrtnum(daytime/1000 % 60, 2);
                break;

            case 'N':
                /* three-digit milliseconds (non-strftime) */
                wrtnum(daytime % 1000, 3);
                break;

            case 'T':
                /* 24-hour clock time w/seconds: %H:%M:%S */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOURSECS);
                goto do_subfmt;

            case 'X':
                /* locale time representation without the date */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIME);
                goto do_subfmt;

            case 'z':
                /* time zone abbreviation */
                {
                    for (const char *p = tzabbr ; *p != '\0' ; ++p)
                        wrtch(*p);
                }
                break;

            case 'Z':
                /* time zone UTC offset, four digits (+0500) */
                {
                    int32_t o = tzofs;
                    if (o < 0)
                        wrtch('-'), o = -o;
                    else
                        wrtch('+');

                    wrtnum(o/(60*60*1000), 2);
                    pound = FALSE;
                    wrtnum(o/(60*1000) % 60, 2);
                }
                break;

            case 'c':
                /* preferred locale date and time stamp */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIMESTAMP);
                goto do_subfmt;

            case 'D':
                /* short date - %m/%d/%y */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_SHORTDATE);
                goto do_subfmt;

            case 'F':
                /* database-style date: %Y-%m-%d */
                subfmt = "%Y-%m-%d";
                subfmtl = 8;
                goto do_subfmt;

            case 's':
                /* Unix Epoch timestamp as an integer */
                {
                    /* 
                     *   The Unix timestamp is the number of seconds after
                     *   (or before, if negative) 1/1/1970 00:00 UTC.  First
                     *   calculate the number of days after (before) 1/1/1970
                     *   by subtracting the Unix Epoch day number from our
                     *   internal day number; then multiply that by the
                     *   number of seconds in a day (24*60*60) to get the
                     *   Unix timestamp of midnight on that day, then add the
                     *   number of seconds into the day ('daytime' stores
                     *   milliseconds, so divide it by 1000).
                     *   
                     *   Note that we need to adjust back to UTC by
                     *   subtracting the time zone offset.
                     *   
                     *   As we've discussed elsewhere in this file, a double
                     *   is big enough for the Unix timestamp value for any
                     *   day number we can store, and represents it exactly
                     *   since we're working in whole numbers.
                     */
                    double utime = (dayno - caldate_t::UNIX_EPOCH_DAYNO)
                                   * 24.*60.*60.
                                   + daytime/1000
                                   - tzofs/1000;

                    /* format it to a buffer and copy to the output */
                    char ubuf[60];
                    sprintf(ubuf, "%.0lf", utime);
                    wrtstr(ubuf);
                }
                break;

            case 'x':
                /* preferred locale date representation */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_DATE);
                goto do_subfmt;

            case '%':
                /* a literal % */
                wrtch('%');
                break;

            default:
                /* 
                 *   anything else is an error; copy the whole %x literally
                 *   to make the unparsed format character apparent
                 */
                wrtch('%');
                wrtch(*fmt);
                break;
            }
        }
        else
        {
            /* it's an ordinary character, so copy it literally */
            wrtch(*fmt);
        }
    }

    /* add a nul if there's room (but don't count it in the result length) */
    if (buflen > 0)
        *buf++ = '\0';

    /* return the total space needed */
    return outlen;
}